

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.h
# Opt level: O0

void __thiscall
Jinx::Impl::Script::ExecutionFrame::ExecutionFrame(ExecutionFrame *this,BufferPtr *b,char *n)

{
  shared_ptr<Jinx::Buffer> local_30;
  char *local_20;
  char *n_local;
  BufferPtr *b_local;
  ExecutionFrame *this_local;
  
  local_20 = n;
  n_local = (char *)b;
  b_local = &this->bytecode;
  std::shared_ptr<Jinx::Buffer>::shared_ptr(&this->bytecode,b);
  std::shared_ptr<Jinx::Buffer>::shared_ptr(&local_30,b);
  BinaryReader::BinaryReader(&this->reader,&local_30);
  std::shared_ptr<Jinx::Buffer>::~shared_ptr(&local_30);
  this->name = local_20;
  this->stackTop = 0;
  this->onReturn = Continue;
  return;
}

Assistant:

ExecutionFrame(BufferPtr b, const char * n) : bytecode(b), reader(b), name(n) {}